

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.cpp
# Opt level: O1

char * __thiscall
ASDCP::MXF::IndexTableSegment::IndexEntry::EncodeString
          (IndexEntry *this,char *str_buf,ui32_t buf_len)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  undefined1 uVar4;
  char txt_flags [6];
  char intbuf [64];
  undefined1 local_7e;
  undefined1 local_7d;
  undefined1 local_7c;
  undefined1 local_7b;
  undefined1 local_7a;
  undefined1 local_79;
  char local_78 [72];
  
  bVar1 = this->Flags;
  local_7e = 0x72;
  if (-1 < (char)bVar1) {
    local_7e = 0x20;
  }
  local_7d = 0x73;
  if ((bVar1 & 0x40) == 0) {
    local_7d = 0x20;
  }
  local_7c = 0x66;
  if ((bVar1 & 0x20) == 0) {
    local_7c = 0x20;
  }
  local_7b = 0x62;
  if ((bVar1 & 0x10) == 0) {
    local_7b = 0x20;
  }
  uVar4 = 0x49;
  if ((bVar1 & 0xf) == 2) {
    uVar4 = 0x50;
  }
  local_7a = 0x42;
  if ((bVar1 & 0xf) != 3) {
    local_7a = uVar4;
  }
  local_79 = 0;
  cVar2 = this->TemporalOffset;
  cVar3 = this->KeyFrameOffset;
  snprintf(local_78,0x40,"%lld",this->StreamOffset);
  snprintf(str_buf,(ulong)buf_len,"%3i %-3hhu %s %s",(ulong)(uint)(int)cVar2,(ulong)(uint)(int)cVar3
           ,&local_7e,local_78);
  return str_buf;
}

Assistant:

const char*
ASDCP::MXF::IndexTableSegment::IndexEntry::EncodeString(char* str_buf, ui32_t buf_len) const
{
  char intbuf[IntBufferLen];
  char txt_flags[6];

  txt_flags[0] = ( (Flags & 0x80) != 0 ) ? 'r' : ' ';
  txt_flags[1] = ( (Flags & 0x40) != 0 ) ? 's' : ' ';
  txt_flags[2] = ( (Flags & 0x20) != 0 ) ? 'f' : ' ';
  txt_flags[3] = ( (Flags & 0x10) != 0 ) ? 'b' : ' ';
  txt_flags[4] = ( (Flags & 0x0f) == 3 ) ? 'B' : ( (Flags & 0x0f) == 2 ) ? 'P' : 'I';
  txt_flags[5] = 0;

  snprintf(str_buf, buf_len, "%3i %-3hhu %s %s",
	   TemporalOffset, KeyFrameOffset, txt_flags,
	   i64sz(StreamOffset, intbuf));

  return str_buf;
}